

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O3

void __thiscall jsonnet::internal::anon_unknown_0::Heap::markFrom(Heap *this,HeapEntity *from)

{
  HeapEntity *pHVar1;
  pointer ppHVar2;
  _func_int **pp_Var3;
  long lVar4;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *extraout_RDX;
  undefined8 uVar5;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *vec;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *pvVar6;
  GarbageCollectionMark GVar7;
  pointer pSVar8;
  _func_int **pp_Var9;
  pointer pSVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<State,_std::allocator<State>_> stack;
  HeapEntity *next;
  vector<State,_std::allocator<State>_> local_58;
  HeapEntity *local_40;
  HeapEntity *local_38;
  
  local_38 = from;
  if (from == (HeapEntity *)0x0) {
    __assert_fail("from != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h",
                  0x160,
                  "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)");
  }
  local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
  ::emplace_back<jsonnet::internal::(anonymous_namespace)::HeapEntity*&>
            ((vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
              *)&local_58,&local_38);
  if (local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    GVar7 = (char)this + '\x01';
    pSVar10 = local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      pHVar1 = pSVar10[-1].ent;
      if (pHVar1->mark != GVar7) {
        pHVar1->mark = GVar7;
        switch(pHVar1->type) {
        case THUNK:
          auVar14 = __dynamic_cast(pHVar1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                   &(anonymous_namespace)::HeapThunk::typeinfo,0);
          pvVar6 = auVar14._8_8_;
          if (auVar14._0_8_ == 0) {
            __assert_fail("dynamic_cast<HeapThunk *>(curr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                          ,0x19b,
                          "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                         );
          }
          if (pHVar1->field_0xa == '\x01') {
            if (((ulong)pHVar1[1]._vptr_HeapEntity & 0x10) != 0) {
              addIfHeapEntity(*(Heap **)&pHVar1[1].mark,(HeapEntity *)&pSVar10[-1].children,pvVar6);
            }
          }
          else {
            auVar15._8_8_ = pvVar6;
            auVar15._0_8_ = (HeapEntity *)pHVar1[4]._vptr_HeapEntity;
            if ((HeapEntity *)pHVar1[4]._vptr_HeapEntity != pHVar1 + 3) {
              do {
                addIfHeapEntity((Heap *)auVar15._0_8_[1]._M_parent,
                                (HeapEntity *)&pSVar10[-1].children,auVar15._8_8_);
                auVar15 = std::_Rb_tree_increment(auVar15._0_8_);
                pvVar6 = auVar15._8_8_;
              } while (auVar15._0_8_ != pHVar1 + 3);
            }
            if (*(Heap **)&pHVar1[5].mark != (Heap *)0x0) {
              addIfHeapEntity(*(Heap **)&pHVar1[5].mark,(HeapEntity *)&pSVar10[-1].children,pvVar6);
            }
          }
          break;
        case ARRAY:
          auVar14 = __dynamic_cast(pHVar1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                   &(anonymous_namespace)::HeapArray::typeinfo,0);
          pvVar6 = auVar14._8_8_;
          if (auVar14._0_8_ == 0) {
            __assert_fail("dynamic_cast<HeapArray *>(curr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                          ,0x18b,
                          "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                         );
          }
          pp_Var9 = pHVar1[1]._vptr_HeapEntity;
          pp_Var3 = *(_func_int ***)&pHVar1[1].mark;
          if (pp_Var9 != pp_Var3) {
            do {
              addIfHeapEntity((Heap *)*pp_Var9,(HeapEntity *)&pSVar10[-1].children,pvVar6);
              pp_Var9 = pp_Var9 + 1;
              pvVar6 = extraout_RDX;
            } while (pp_Var9 != pp_Var3);
          }
          break;
        case CLOSURE:
          auVar14 = __dynamic_cast(pHVar1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                   &(anonymous_namespace)::HeapClosure::typeinfo,0);
          pvVar6 = auVar14._8_8_;
          if (auVar14._0_8_ == 0) {
            __assert_fail("dynamic_cast<HeapClosure *>(curr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                          ,0x192,
                          "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                         );
          }
          auVar12._8_8_ = pvVar6;
          auVar12._0_8_ = *(undefined1 **)&pHVar1[2].mark;
          if (*(undefined1 **)&pHVar1[2].mark != &pHVar1[1].mark) {
            do {
              addIfHeapEntity((Heap *)auVar12._0_8_[1]._M_parent,(HeapEntity *)&pSVar10[-1].children
                              ,auVar12._8_8_);
              auVar12 = std::_Rb_tree_increment(auVar12._0_8_);
              pvVar6 = auVar12._8_8_;
            } while (auVar12._0_8_ != &pHVar1[1].mark);
          }
          if ((Heap *)pHVar1[4]._vptr_HeapEntity != (Heap *)0x0) {
            addIfHeapEntity((Heap *)pHVar1[4]._vptr_HeapEntity,(HeapEntity *)&pSVar10[-1].children,
                            pvVar6);
          }
          break;
        case STRING:
          lVar4 = __dynamic_cast(pHVar1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                 &(anonymous_namespace)::HeapString::typeinfo,0);
          if (lVar4 == 0) {
            __assert_fail("dynamic_cast<HeapString *>(curr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                          ,0x1a9,
                          "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                         );
          }
          break;
        case SIMPLE_OBJECT:
          auVar14 = __dynamic_cast(pHVar1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                   &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
          if (auVar14._0_8_ == 0) {
            __assert_fail("dynamic_cast<HeapSimpleObject *>(curr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                          ,0x174,
                          "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                         );
          }
          auVar11._8_8_ = auVar14._8_8_;
          auVar11._0_8_ = *(undefined1 **)&pHVar1[2].mark;
          if (*(undefined1 **)&pHVar1[2].mark != &pHVar1[1].mark) {
            do {
              addIfHeapEntity((Heap *)auVar11._0_8_[1]._M_parent,(HeapEntity *)&pSVar10[-1].children
                              ,auVar11._8_8_);
              auVar11 = std::_Rb_tree_increment(auVar11._0_8_);
            } while (auVar11._0_8_ != &pHVar1[1].mark);
          }
          break;
        case COMPREHENSION_OBJECT:
          auVar14 = __dynamic_cast(pHVar1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                   &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
          uVar5 = auVar14._8_8_;
          if (auVar14._0_8_ == 0) {
            __assert_fail("dynamic_cast<HeapComprehensionObject *>(curr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                          ,0x182,
                          "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                         );
          }
          auVar14._8_8_ = uVar5;
          auVar14._0_8_ = *(undefined1 **)&pHVar1[2].mark;
          if (*(undefined1 **)&pHVar1[2].mark != &pHVar1[1].mark) {
            do {
              addIfHeapEntity((Heap *)auVar14._0_8_[1]._M_parent,(HeapEntity *)&pSVar10[-1].children
                              ,auVar14._8_8_);
              auVar14 = std::_Rb_tree_increment(auVar14._0_8_);
              uVar5 = auVar14._8_8_;
            } while (auVar14._0_8_ != &pHVar1[1].mark);
          }
          auVar13._8_8_ = uVar5;
          auVar13._0_8_ = *(undefined1 **)&pHVar1[6].mark;
          if (*(undefined1 **)&pHVar1[6].mark != &pHVar1[5].mark) {
            do {
              addIfHeapEntity((Heap *)auVar13._0_8_[1]._M_parent,(HeapEntity *)&pSVar10[-1].children
                              ,auVar13._8_8_);
              auVar13 = std::_Rb_tree_increment(auVar13._0_8_);
            } while (auVar13._0_8_ != &pHVar1[5].mark);
          }
          break;
        case EXTENDED_OBJECT:
          auVar14 = __dynamic_cast(pHVar1,&(anonymous_namespace)::HeapEntity::typeinfo,
                                   &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
          if (auVar14._0_8_ == 0) {
            __assert_fail("dynamic_cast<HeapExtendedObject *>(curr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                          ,0x17b,
                          "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                         );
          }
          addIfHeapEntity((Heap *)pHVar1[1]._vptr_HeapEntity,(HeapEntity *)&pSVar10[-1].children,
                          auVar14._8_8_);
          addIfHeapEntity(*(Heap **)&pHVar1[1].mark,(HeapEntity *)&pSVar10[-1].children,vec);
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x1ac,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
      }
      ppHVar2 = pSVar10[-1].children.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppHVar2 ==
          pSVar10[-1].children.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pSVar8 = pSVar10 + -1;
        ppHVar2 = pSVar10[-1].children.
                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
        _M_finish = pSVar8;
        if (ppHVar2 != (pointer)0x0) {
          operator_delete(ppHVar2,(long)pSVar10[-1].children.
                                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)ppHVar2);
        }
      }
      else {
        local_40 = ppHVar2[-1];
        pSVar10[-1].children.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppHVar2 + -1;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
        ::emplace_back<jsonnet::internal::(anonymous_namespace)::HeapEntity*&>
                  ((vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
                    *)&local_58,&local_40);
        pSVar8 = local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      pSVar10 = pSVar8;
    } while (pSVar8 != local_58.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                       super__Vector_impl_data._M_start);
  }
  std::vector<State,_std::allocator<State>_>::~vector(&local_58);
  return;
}

Assistant:

void markFrom(HeapEntity *from)
    {
        assert(from != nullptr);
        const GarbageCollectionMark thisMark = lastMark + 1;
        struct State {
            HeapEntity *ent;
            std::vector<HeapEntity *> children;
            State(HeapEntity *ent) : ent(ent) {}
        };

        std::vector<State> stack;
        stack.emplace_back(from);

        while (stack.size() > 0) {
            size_t curr_index = stack.size() - 1;
            State &s = stack[curr_index];
            HeapEntity *curr = s.ent;
            if (curr->mark != thisMark) {
                curr->mark = thisMark;

                switch(curr->type) {
                    case HeapEntity::SIMPLE_OBJECT: {
                        assert(dynamic_cast<HeapSimpleObject *>(curr));
                        auto *obj = static_cast<HeapSimpleObject *>(curr);
                        for (auto upv : obj->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        break;
                    }
                    case HeapEntity::EXTENDED_OBJECT: {
                        assert(dynamic_cast<HeapExtendedObject *>(curr));
                        auto *obj = static_cast<HeapExtendedObject *>(curr);
                        addIfHeapEntity(obj->left, s.children);
                        addIfHeapEntity(obj->right, s.children);
                        break;
                    }
                    case HeapEntity::COMPREHENSION_OBJECT: {
                        assert(dynamic_cast<HeapComprehensionObject *>(curr));
                        auto *obj = static_cast<HeapComprehensionObject *>(curr);
                        for (auto upv : obj->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        for (auto upv : obj->compValues)
                            addIfHeapEntity(upv.second, s.children);
                        break;
                    }
                    case HeapEntity::ARRAY: {
                        assert(dynamic_cast<HeapArray *>(curr));
                        auto *arr = static_cast<HeapArray *>(curr);
                        for (auto el : arr->elements)
                            addIfHeapEntity(el, s.children);
                        break;
                    }
                    case HeapEntity::CLOSURE: {
                        assert(dynamic_cast<HeapClosure *>(curr));
                        auto *func = static_cast<HeapClosure *>(curr);
                        for (auto upv : func->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        if (func->self)
                            addIfHeapEntity(func->self, s.children);
                        break;
                    }
                    case HeapEntity::THUNK: {
                        assert(dynamic_cast<HeapThunk *>(curr));
                        auto *thunk = static_cast<HeapThunk *>(curr);
                        if (thunk->filled) {
                            if (thunk->content.isHeap())
                                addIfHeapEntity(thunk->content.v.h, s.children);
                        } else {
                            for (auto upv : thunk->upValues)
                                addIfHeapEntity(upv.second, s.children);
                            if (thunk->self)
                                addIfHeapEntity(thunk->self, s.children);
                        }
                        break;
                    }
                    case HeapEntity::STRING:
                        assert(dynamic_cast<HeapString *>(curr));
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            if (s.children.size() > 0) {
                HeapEntity *next = s.children[s.children.size() - 1];
                s.children.pop_back();
                stack.emplace_back(next);  // CAUTION: s invalidated here
            } else {
                stack.pop_back();  // CAUTION: s invalidated here
            }
        }
    }